

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_byte.hpp
# Opt level: O1

void ans_byte_decompress(void *dst,size_t to_decode,void *cSrc,size_t cSrcSize)

{
  uint *puVar1;
  long *plVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ans_byte_decode ans_frame;
  ans_byte_decode local_468;
  
  ans_byte_decode::load(&local_468,(uint8_t *)cSrc);
  plVar2 = (long *)((long)cSrc + (cSrcSize - 0x20));
  uVar3 = *plVar2 + local_468.lower_bound;
  if ((to_decode & 0xfffffffffffffffc) == 0) {
    sVar4 = 0;
  }
  else {
    uVar5 = *(long *)((long)cSrc + (cSrcSize - 0x18)) + local_468.lower_bound;
    uVar6 = *(long *)((long)cSrc + (cSrcSize - 0x10)) + local_468.lower_bound;
    uVar7 = *(long *)((long)cSrc + (cSrcSize - 8)) + local_468.lower_bound;
    sVar4 = 0;
    do {
      uVar8 = local_468.frame_mask & uVar7;
      uVar7 = (ulong)local_468.table.super__Vector_base<dec_entry,_std::allocator<dec_entry>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar8].offset +
              (uVar7 >> (local_468.frame_log2 & 0x3f)) *
              (ulong)local_468.table.super__Vector_base<dec_entry,_std::allocator<dec_entry>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar8].freq;
      if (uVar7 < local_468.lower_bound) {
        puVar1 = (uint *)((long)plVar2 + -4);
        plVar2 = (long *)((long)plVar2 + -4);
        uVar7 = uVar7 << 0x20 | (ulong)*puVar1;
      }
      *(uint8_t *)((long)dst + sVar4) =
           local_468.table.super__Vector_base<dec_entry,_std::allocator<dec_entry>_>._M_impl.
           super__Vector_impl_data._M_start[uVar8].sym;
      uVar8 = local_468.frame_mask & uVar6;
      uVar6 = (ulong)local_468.table.super__Vector_base<dec_entry,_std::allocator<dec_entry>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar8].offset +
              (uVar6 >> (local_468.frame_log2 & 0x3f)) *
              (ulong)local_468.table.super__Vector_base<dec_entry,_std::allocator<dec_entry>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar8].freq;
      if (uVar6 < local_468.lower_bound) {
        puVar1 = (uint *)((long)plVar2 + -4);
        plVar2 = (long *)((long)plVar2 + -4);
        uVar6 = uVar6 << 0x20 | (ulong)*puVar1;
      }
      *(uint8_t *)((long)dst + sVar4 + 1) =
           local_468.table.super__Vector_base<dec_entry,_std::allocator<dec_entry>_>._M_impl.
           super__Vector_impl_data._M_start[uVar8].sym;
      uVar8 = local_468.frame_mask & uVar5;
      uVar5 = (ulong)local_468.table.super__Vector_base<dec_entry,_std::allocator<dec_entry>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar8].offset +
              (uVar5 >> (local_468.frame_log2 & 0x3f)) *
              (ulong)local_468.table.super__Vector_base<dec_entry,_std::allocator<dec_entry>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar8].freq;
      if (uVar5 < local_468.lower_bound) {
        puVar1 = (uint *)((long)plVar2 + -4);
        plVar2 = (long *)((long)plVar2 + -4);
        uVar5 = uVar5 << 0x20 | (ulong)*puVar1;
      }
      *(uint8_t *)((long)dst + sVar4 + 2) =
           local_468.table.super__Vector_base<dec_entry,_std::allocator<dec_entry>_>._M_impl.
           super__Vector_impl_data._M_start[uVar8].sym;
      uVar8 = local_468.frame_mask & uVar3;
      uVar3 = (ulong)local_468.table.super__Vector_base<dec_entry,_std::allocator<dec_entry>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar8].offset +
              (uVar3 >> (local_468.frame_log2 & 0x3f)) *
              (ulong)local_468.table.super__Vector_base<dec_entry,_std::allocator<dec_entry>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar8].freq;
      if (uVar3 < local_468.lower_bound) {
        puVar1 = (uint *)((long)plVar2 + -4);
        plVar2 = (long *)((long)plVar2 + -4);
        uVar3 = uVar3 << 0x20 | (ulong)*puVar1;
      }
      *(uint8_t *)((long)dst + sVar4 + 3) =
           local_468.table.super__Vector_base<dec_entry,_std::allocator<dec_entry>_>._M_impl.
           super__Vector_impl_data._M_start[uVar8].sym;
      sVar4 = sVar4 + 4;
    } while ((to_decode & 0xfffffffffffffffc) != sVar4);
  }
  for (; sVar4 != to_decode; sVar4 = sVar4 + 1) {
    uVar5 = local_468.frame_mask & uVar3;
    uVar3 = (ulong)local_468.table.super__Vector_base<dec_entry,_std::allocator<dec_entry>_>._M_impl
                   .super__Vector_impl_data._M_start[uVar5].offset +
            (uVar3 >> (local_468.frame_log2 & 0x3f)) *
            (ulong)local_468.table.super__Vector_base<dec_entry,_std::allocator<dec_entry>_>._M_impl
                   .super__Vector_impl_data._M_start[uVar5].freq;
    if (uVar3 < local_468.lower_bound) {
      puVar1 = (uint *)((long)plVar2 + -4);
      plVar2 = (long *)((long)plVar2 + -4);
      uVar3 = uVar3 << 0x20 | (ulong)*puVar1;
    }
    *(uint8_t *)((long)dst + sVar4) =
         local_468.table.super__Vector_base<dec_entry,_std::allocator<dec_entry>_>._M_impl.
         super__Vector_impl_data._M_start[uVar5].sym;
  }
  if (local_468.table.super__Vector_base<dec_entry,_std::allocator<dec_entry>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_468.table.super__Vector_base<dec_entry,_std::allocator<dec_entry>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_468.table.super__Vector_base<dec_entry,_std::allocator<dec_entry>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_468.table.super__Vector_base<dec_entry,_std::allocator<dec_entry>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ans_byte_decompress(
    void* dst, size_t to_decode, const void* cSrc, size_t cSrcSize)
{
    auto in_u8 = reinterpret_cast<const uint8_t*>(cSrc);
    auto ans_frame = ans_byte_decode::load(in_u8);
    in_u8 += cSrcSize;

    auto state_d = ans_frame.init_state(in_u8);
    auto state_c = ans_frame.init_state(in_u8);
    auto state_b = ans_frame.init_state(in_u8);
    auto state_a = ans_frame.init_state(in_u8);

    size_t cur_idx = 0;
    auto out_u8 = reinterpret_cast<uint8_t*>(dst);
    size_t fast_decode = to_decode - (to_decode % 4);
    while (cur_idx != fast_decode) {
        out_u8[cur_idx] = ans_frame.decode_sym(state_d, in_u8);
        out_u8[cur_idx + 1] = ans_frame.decode_sym(state_c, in_u8);
        out_u8[cur_idx + 2] = ans_frame.decode_sym(state_b, in_u8);
        out_u8[cur_idx + 3] = ans_frame.decode_sym(state_a, in_u8);
        cur_idx += 4;
    }
    while (cur_idx != to_decode) {
        out_u8[cur_idx++] = ans_frame.decode_sym(state_a, in_u8);
    }
}